

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O2

TrackInfo * __thiscall MIDISong2::FindNextDue(MIDISong2 *this)

{
  int iVar1;
  TrackInfo *pTVar2;
  TrackInfo *pTVar3;
  TrackInfo *pTVar4;
  uint uVar5;
  bool bVar6;
  
  pTVar3 = this->TrackDue;
  if ((pTVar3->Finished != false) || (pTVar2 = pTVar3, pTVar3->Delay != 0)) {
    iVar1 = this->Format;
    if (iVar1 == 0) {
      pTVar3 = (TrackInfo *)0x0;
      if (this->Tracks->Finished == false) {
        pTVar3 = this->Tracks;
      }
      return pTVar3;
    }
    if (iVar1 == 2) {
      pTVar2 = pTVar3 + pTVar3->Finished;
      if (this->Tracks + this->NumTracks <= pTVar3 + pTVar3->Finished) {
        pTVar2 = (TrackInfo *)0x0;
      }
    }
    else {
      if (iVar1 != 1) {
        return (TrackInfo *)0x0;
      }
      pTVar3 = this->Tracks;
      pTVar2 = (TrackInfo *)0x0;
      pTVar4 = (TrackInfo *)(ulong)(uint)this->NumTracks;
      if (this->NumTracks < 1) {
        pTVar4 = pTVar2;
      }
      uVar5 = 0xffffffff;
      while (bVar6 = pTVar4 != (TrackInfo *)0x0, pTVar4 = (TrackInfo *)&pTVar4[-1].field_0x3f, bVar6
            ) {
        if ((pTVar3->Finished == false) && (pTVar3->Delay < uVar5)) {
          pTVar2 = pTVar3;
          uVar5 = pTVar3->Delay;
        }
        pTVar3 = pTVar3 + 1;
      }
    }
  }
  return pTVar2;
}

Assistant:

MIDISong2::TrackInfo *MIDISong2::FindNextDue ()
{
	TrackInfo *track;
	DWORD best;
	int i;

	// Give precedence to whichever track last had events taken from it.
	if (!TrackDue->Finished && TrackDue->Delay == 0)
	{
		return TrackDue;
	}

	switch (Format)
	{
	case 0:
		return Tracks[0].Finished ? NULL : Tracks;
		
	case 1:
		track = NULL;
		best = 0xFFFFFFFF;
		for (i = 0; i < NumTracks; ++i)
		{
			if (!Tracks[i].Finished)
			{
				if (Tracks[i].Delay < best)
				{
					best = Tracks[i].Delay;
					track = &Tracks[i];
				}
			}
		}
		return track;

	case 2:
		track = TrackDue;
		if (track->Finished)
		{
			track++;
		}
		return track < &Tracks[NumTracks] ? track : NULL;
	}
	return NULL;
}